

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feat.c
# Opt level: O1

void feat_1s_c_d_ld_dd_cep2feat(feat_t *fcb,mfcc_t **mfc,mfcc_t **feat)

{
  int iVar1;
  mfcc_t *pmVar2;
  mfcc_t *pmVar3;
  mfcc_t *pmVar4;
  mfcc_t *pmVar5;
  mfcc_t *pmVar6;
  long lVar7;
  long lVar8;
  
  if (fcb == (feat_t *)0x0) {
    __assert_fail("fcb",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                  ,0x279,"void feat_1s_c_d_ld_dd_cep2feat(feat_t *, mfcc_t **, mfcc_t **)");
  }
  if (fcb->n_stream != 1) {
    __assert_fail("feat_n_stream(fcb) == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                  ,0x27a,"void feat_1s_c_d_ld_dd_cep2feat(feat_t *, mfcc_t **, mfcc_t **)");
  }
  if (*fcb->stream_len != fcb->cepsize * 4) {
    __assert_fail("feat_stream_len(fcb, 0) == feat_cepsize(fcb) * 4",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                  ,0x27b,"void feat_1s_c_d_ld_dd_cep2feat(feat_t *, mfcc_t **, mfcc_t **)");
  }
  if (fcb->window_size == 4) {
    memcpy(*feat,*mfc,(long)fcb->cepsize << 2);
    iVar1 = fcb->cepsize;
    lVar7 = (long)iVar1;
    pmVar2 = *feat;
    if (0 < lVar7) {
      pmVar3 = mfc[-2];
      pmVar4 = mfc[2];
      lVar8 = 0;
      do {
        pmVar2[lVar7 + lVar8] = (mfcc_t)((float)pmVar4[lVar8] - (float)pmVar3[lVar8]);
        lVar8 = lVar8 + 1;
      } while (lVar7 != lVar8);
    }
    if (0 < iVar1) {
      pmVar3 = mfc[-4];
      pmVar4 = mfc[4];
      lVar8 = 0;
      do {
        pmVar2[lVar7 * 2 + lVar8] = (mfcc_t)((float)pmVar4[lVar8] - (float)pmVar3[lVar8]);
        lVar8 = lVar8 + 1;
      } while (lVar7 != lVar8);
    }
    if (0 < iVar1) {
      pmVar3 = mfc[3];
      pmVar4 = mfc[-3];
      pmVar5 = mfc[-1];
      pmVar6 = mfc[1];
      lVar8 = 0;
      do {
        pmVar2[lVar7 * 3 + lVar8] =
             (mfcc_t)(((float)pmVar3[lVar8] - (float)pmVar5[lVar8]) -
                     ((float)pmVar6[lVar8] - (float)pmVar4[lVar8]));
        lVar8 = lVar8 + 1;
      } while (lVar7 != lVar8);
    }
    return;
  }
  __assert_fail("feat_window_size(fcb) == FEAT_DCEP_WIN * 2",
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                ,0x27c,"void feat_1s_c_d_ld_dd_cep2feat(feat_t *, mfcc_t **, mfcc_t **)");
}

Assistant:

static void
feat_1s_c_d_ld_dd_cep2feat(feat_t * fcb, mfcc_t ** mfc, mfcc_t ** feat)
{
    mfcc_t *f;
    mfcc_t *w, *_w;
    mfcc_t *w1, *w_1, *_w1, *_w_1;
    mfcc_t d1, d2;
    int32 i;

    assert(fcb);
    assert(feat_n_stream(fcb) == 1);
    assert(feat_stream_len(fcb, 0) == feat_cepsize(fcb) * 4);
    assert(feat_window_size(fcb) == FEAT_DCEP_WIN * 2);

    /* CEP */
    memcpy(feat[0], mfc[0], feat_cepsize(fcb) * sizeof(mfcc_t));

    /*
     * DCEP: mfc[w] - mfc[-w], where w = FEAT_DCEP_WIN;
     */
    f = feat[0] + feat_cepsize(fcb);
    w = mfc[FEAT_DCEP_WIN];
    _w = mfc[-FEAT_DCEP_WIN];

    for (i = 0; i < feat_cepsize(fcb); i++)
        f[i] = w[i] - _w[i];

    /*
     * LDCEP: mfc[w] - mfc[-w], where w = FEAT_DCEP_WIN * 2;
     */
    f += feat_cepsize(fcb);
    w = mfc[FEAT_DCEP_WIN * 2];
    _w = mfc[-FEAT_DCEP_WIN * 2];

    for (i = 0; i < feat_cepsize(fcb); i++)
        f[i] = w[i] - _w[i];

    /* 
     * D2CEP: (mfc[w+1] - mfc[-w+1]) - (mfc[w-1] - mfc[-w-1]), 
     * where w = FEAT_DCEP_WIN 
     */
    f += feat_cepsize(fcb);

    w1 = mfc[FEAT_DCEP_WIN + 1];
    _w1 = mfc[-FEAT_DCEP_WIN + 1];
    w_1 = mfc[FEAT_DCEP_WIN - 1];
    _w_1 = mfc[-FEAT_DCEP_WIN - 1];

    for (i = 0; i < feat_cepsize(fcb); i++) {
        d1 = w1[i] - _w1[i];
        d2 = w_1[i] - _w_1[i];

        f[i] = d1 - d2;
    }
}